

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnOpcodeIndex
          (BinaryReaderObjdumpDisassemble *this,Index value)

{
  uint uVar1;
  bool bVar2;
  Enum EVar3;
  size_type sVar4;
  const_pointer pvVar5;
  string_view sVar6;
  byte local_9d;
  byte local_91;
  byte local_85;
  byte local_79;
  size_t local_70;
  char *local_68;
  size_t local_60;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  undefined1 local_30 [8];
  string_view name;
  Index value_local;
  BinaryReaderObjdumpDisassemble *this_local;
  
  name._M_str._4_4_ = value;
  if ((this->in_function_body & 1U) == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
    return (Result)this_local._4_4_;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  EVar3 = Opcode::operator_cast_to_Enum(&(this->super_BinaryReaderObjdumpBase).current_opcode);
  local_79 = 0;
  if (EVar3 == Call) {
    sVar6 = anon_unknown_15::BinaryReaderObjdumpBase::GetFunctionName
                      (&this->super_BinaryReaderObjdumpBase,name._M_str._4_4_);
    local_40 = sVar6._M_len;
    local_30 = (undefined1  [8])local_40;
    local_38 = sVar6._M_str;
    name._M_len = (size_t)local_38;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    local_79 = bVar2 ^ 0xff;
  }
  uVar1 = name._M_str._4_4_;
  if ((local_79 & 1) != 0) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    LogOpcode(this,"%d <%.*s>",(ulong)uVar1,sVar4 & 0xffffffff,pvVar5);
    goto LAB_00134032;
  }
  EVar3 = Opcode::operator_cast_to_Enum(&(this->super_BinaryReaderObjdumpBase).current_opcode);
  local_85 = 0;
  if (EVar3 == Throw) {
    sVar6 = anon_unknown_15::BinaryReaderObjdumpBase::GetTagName
                      (&this->super_BinaryReaderObjdumpBase,name._M_str._4_4_);
    local_50 = sVar6._M_len;
    local_30 = (undefined1  [8])local_50;
    local_48 = sVar6._M_str;
    name._M_len = (size_t)local_48;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    local_85 = bVar2 ^ 0xff;
  }
  uVar1 = name._M_str._4_4_;
  if ((local_85 & 1) != 0) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    LogOpcode(this,"%d <%.*s>",(ulong)uVar1,sVar4 & 0xffffffff,pvVar5);
    goto LAB_00134032;
  }
  EVar3 = Opcode::operator_cast_to_Enum(&(this->super_BinaryReaderObjdumpBase).current_opcode);
  if (EVar3 == GlobalGet) {
LAB_00133ed0:
    sVar6 = anon_unknown_15::BinaryReaderObjdumpBase::GetGlobalName
                      (&this->super_BinaryReaderObjdumpBase,name._M_str._4_4_);
    local_60 = sVar6._M_len;
    local_30 = (undefined1  [8])local_60;
    local_58 = sVar6._M_str;
    name._M_len = (size_t)local_58;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    local_91 = bVar2 ^ 0xff;
  }
  else {
    EVar3 = Opcode::operator_cast_to_Enum(&(this->super_BinaryReaderObjdumpBase).current_opcode);
    local_91 = 0;
    if (EVar3 == GlobalSet) goto LAB_00133ed0;
  }
  uVar1 = name._M_str._4_4_;
  if ((local_91 & 1) != 0) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    LogOpcode(this,"%d <%.*s>",(ulong)uVar1,sVar4 & 0xffffffff,pvVar5);
    goto LAB_00134032;
  }
  EVar3 = Opcode::operator_cast_to_Enum(&(this->super_BinaryReaderObjdumpBase).current_opcode);
  if (EVar3 == LocalGet) {
LAB_00133f8c:
    sVar6 = anon_unknown_15::BinaryReaderObjdumpBase::GetLocalName
                      (&this->super_BinaryReaderObjdumpBase,this->current_function_index,
                       name._M_str._4_4_);
    local_70 = sVar6._M_len;
    local_30 = (undefined1  [8])local_70;
    local_68 = sVar6._M_str;
    name._M_len = (size_t)local_68;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    local_9d = bVar2 ^ 0xff;
  }
  else {
    EVar3 = Opcode::operator_cast_to_Enum(&(this->super_BinaryReaderObjdumpBase).current_opcode);
    local_9d = 0;
    if (EVar3 == LocalSet) goto LAB_00133f8c;
  }
  uVar1 = name._M_str._4_4_;
  if ((local_9d & 1) == 0) {
    LogOpcode(this,"%d",(ulong)name._M_str._4_4_);
  }
  else {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    LogOpcode(this,"%d <%.*s>",(ulong)uVar1,sVar4 & 0xffffffff,pvVar5);
  }
LAB_00134032:
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeIndex(Index value) {
  if (!in_function_body) {
    return Result::Ok;
  }
  std::string_view name;
  if (current_opcode == Opcode::Call &&
      !(name = GetFunctionName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if (current_opcode == Opcode::Throw &&
             !(name = GetTagName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if ((current_opcode == Opcode::GlobalGet ||
              current_opcode == Opcode::GlobalSet) &&
             !(name = GetGlobalName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if ((current_opcode == Opcode::LocalGet ||
              current_opcode == Opcode::LocalSet) &&
             !(name = GetLocalName(current_function_index, value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else {
    LogOpcode("%d", value);
  }
  return Result::Ok;
}